

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

void __thiscall Assimp::Importer::FreeScene(Importer *this)

{
  aiScene *this_00;
  
  this_00 = this->pimpl->mScene;
  if (this_00 != (aiScene *)0x0) {
    aiScene::~aiScene(this_00);
  }
  operator_delete(this_00,0x80);
  this->pimpl->mScene = (aiScene *)0x0;
  std::__cxx11::string::assign((char *)&this->pimpl->mErrorString);
  return;
}

Assistant:

void Importer::FreeScene( )
{
    ASSIMP_BEGIN_EXCEPTION_REGION();

    delete pimpl->mScene;
    pimpl->mScene = NULL;

    pimpl->mErrorString = "";
    ASSIMP_END_EXCEPTION_REGION(void);
}